

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetArcExtent.cpp
# Opt level: O0

double GeoCalcs::GetArcExtent(double dStartCrs,double dEndCrs,int nOrientation,double dTol)

{
  double local_40;
  double local_38;
  double dAngle;
  double dTol_local;
  double dStack_20;
  int nOrientation_local;
  double dEndCrs_local;
  double dStartCrs_local;
  
  if (dTol <= ABS(dStartCrs - dEndCrs)) {
    dStack_20 = dEndCrs;
    dEndCrs_local = dStartCrs;
    if (nOrientation < 0) {
      std::swap<double>(&dEndCrs_local,&stack0xffffffffffffffe0);
    }
    if (dEndCrs_local <= dStack_20) {
      dEndCrs_local = dEndCrs_local + 6.283185307179586;
    }
    local_40 = dEndCrs_local - dStack_20;
    local_38 = local_40;
    if (nOrientation < 0) {
      local_38 = -local_40;
    }
    dStartCrs_local = local_38;
  }
  else {
    dStartCrs_local = 6.283185307179586;
  }
  return dStartCrs_local;
}

Assistant:

double GetArcExtent(double dStartCrs, double dEndCrs, const int nOrientation, double dTol)
    {
        if (fabs(dStartCrs - dEndCrs) < dTol)
            return M_2PI;

        if (nOrientation < 0)
        {
            std::swap(dStartCrs, dEndCrs);
        }

        double dAngle = dStartCrs > dEndCrs ? dStartCrs - dEndCrs : M_2PI + dStartCrs - dEndCrs;

        if (nOrientation < 0)
            dAngle = -dAngle;

        return dAngle;
    }